

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall
spectest::JSONParser::ParseConstValue
          (JSONParser *this,Type type,Value *out_value,ExpectedNan *out_nan,string_view value_str,
          AllowExpected allow_expected)

{
  string_view value_str_00;
  string_view x;
  string_view x_00;
  string_view value_str_01;
  string_view value_str_02;
  string_view value_str_03;
  string_view value_str_04;
  ExpectedNan *pEVar1;
  bool bVar2;
  Enum EVar3;
  char *pcVar4;
  float val;
  double val_00;
  Ref local_120;
  JSONParser *local_118;
  char *local_110;
  Enum local_108;
  uint32_t local_104;
  size_t sStack_100;
  uint32_t value_2;
  string_view local_f8;
  JSONParser *local_e8;
  char *local_e0;
  Ref local_d8;
  size_t local_d0;
  string_view local_c8;
  JSONParser *local_b8;
  char *local_b0;
  JSONParser *local_a8;
  char *local_a0;
  Enum local_94;
  uint64_t local_90;
  uint64_t value_bits_1;
  char *local_80;
  Enum local_74;
  u64 local_70;
  uint64_t value_1;
  char *local_60;
  Enum local_58;
  uint32_t local_54;
  JSONParser *pJStack_50;
  uint32_t value_bits;
  char *local_48;
  Enum local_40;
  u32 local_3c;
  ExpectedNan *pEStack_38;
  uint32_t value;
  ExpectedNan *out_nan_local;
  Value *out_value_local;
  JSONParser *this_local;
  string_view value_str_local;
  Type type_local;
  
  value_str_local.data_ = (char *)value_str.size_;
  this_local = (JSONParser *)value_str.data_;
  *out_nan = None;
  pEStack_38 = out_nan;
  out_nan_local = (ExpectedNan *)out_value;
  out_value_local = (Value *)this;
  value_str_local.size_._0_4_ = type.enum_;
  EVar3 = wabt::Type::operator_cast_to_Enum((Type *)&value_str_local.size_);
  switch(EVar3) {
  case ExternRef:
    local_e8 = this_local;
    local_e0 = value_str_local.data_;
    wabt::string_view::string_view(&local_f8,"null");
    x.size_ = (size_type)local_e0;
    x.data_ = (char *)local_e8;
    bVar2 = wabt::operator==(x,local_f8);
    if (bVar2) {
      sStack_100 = wabt::interp::Ref::Null.index;
      wabt::interp::Value::Set<wabt::interp::Ref>((Value *)out_nan_local,wabt::interp::Ref::Null);
    }
    else {
      local_118 = this_local;
      local_110 = value_str_local.data_;
      value_str_00.size_ = (size_type)value_str_local.data_;
      value_str_00.data_ = (char *)this_local;
      local_108 = (Enum)ParseI32Value(this,&local_104,value_str_00);
      bVar2 = wabt::Failed((Result)local_108);
      pEVar1 = out_nan_local;
      if (bVar2) {
        wabt::Result::Result((Result *)((long)&value_str_local.size_ + 4),Error);
        return (Result)value_str_local.size_._4_4_;
      }
      wabt::interp::Ref::Ref(&local_120,(ulong)(local_104 + 1));
      wabt::interp::Value::Set<wabt::interp::Ref>((Value *)pEVar1,local_120);
    }
    break;
  case FuncRef:
    local_b8 = this_local;
    local_b0 = value_str_local.data_;
    wabt::string_view::string_view(&local_c8,"null");
    x_00.size_ = (size_type)local_b0;
    x_00.data_ = (char *)local_b8;
    bVar2 = wabt::operator==(x_00,local_c8);
    pEVar1 = out_nan_local;
    if (bVar2) {
      local_d0 = wabt::interp::Ref::Null.index;
      wabt::interp::Value::Set<wabt::interp::Ref>((Value *)out_nan_local,wabt::interp::Ref::Null);
    }
    else {
      if (allow_expected != Yes) {
        __assert_fail("allow_expected == AllowExpected::Yes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/spectest-interp.cc"
                      ,0x32c,
                      "wabt::Result spectest::JSONParser::ParseConstValue(Type, Value *, ExpectedNan *, string_view, AllowExpected)"
                     );
      }
      wabt::interp::Ref::Ref(&local_d8,1);
      wabt::interp::Value::Set<wabt::interp::Ref>((Value *)pEVar1,local_d8);
    }
    break;
  default:
    pcVar4 = wabt::Type::GetName((Type *)&value_str_local.size_);
    PrintError(this,"unknown concrete type: \"%s\"",pcVar4);
    wabt::Result::Result((Result *)((long)&value_str_local.size_ + 4),Error);
    return (Result)value_str_local.size_._4_4_;
  case V128:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/spectest-interp.cc"
                  ,0x325,
                  "wabt::Result spectest::JSONParser::ParseConstValue(Type, Value *, ExpectedNan *, string_view, AllowExpected)"
                 );
  case F64:
    local_a8 = this_local;
    local_a0 = value_str_local.data_;
    value_str_01.size_ = (size_type)value_str_local.data_;
    value_str_01.data_ = (char *)this_local;
    local_94 = (Enum)ParseF64Value(this,&local_90,pEStack_38,value_str_01,allow_expected);
    bVar2 = wabt::Failed((Result)local_94);
    pEVar1 = out_nan_local;
    if (bVar2) {
      wabt::Result::Result((Result *)((long)&value_str_local.size_ + 4),Error);
      return (Result)value_str_local.size_._4_4_;
    }
    val_00 = wabt::Bitcast<double,unsigned_long&>(&local_90);
    wabt::interp::Value::Set<double>((Value *)pEVar1,(f64)val_00);
    break;
  case F32:
    value_1 = (uint64_t)this_local;
    local_60 = value_str_local.data_;
    value_str_03.size_ = (size_type)value_str_local.data_;
    value_str_03.data_ = (char *)this_local;
    local_58 = (Enum)ParseF32Value(this,&local_54,pEStack_38,value_str_03,allow_expected);
    bVar2 = wabt::Failed((Result)local_58);
    pEVar1 = out_nan_local;
    if (bVar2) {
      wabt::Result::Result((Result *)((long)&value_str_local.size_ + 4),Error);
      return (Result)value_str_local.size_._4_4_;
    }
    val = wabt::Bitcast<float,unsigned_int&>(&local_54);
    wabt::interp::Value::Set<float>((Value *)pEVar1,(f32)val);
    break;
  case I64:
    value_bits_1 = (uint64_t)this_local;
    local_80 = value_str_local.data_;
    value_str_02.size_ = (size_type)value_str_local.data_;
    value_str_02.data_ = (char *)this_local;
    local_74 = (Enum)ParseI64Value(this,&local_70,value_str_02);
    bVar2 = wabt::Failed((Result)local_74);
    if (bVar2) {
      wabt::Result::Result((Result *)((long)&value_str_local.size_ + 4),Error);
      return (Result)value_str_local.size_._4_4_;
    }
    wabt::interp::Value::Set<unsigned_long>((Value *)out_nan_local,local_70);
    break;
  case I32:
    pJStack_50 = this_local;
    local_48 = value_str_local.data_;
    value_str_04.size_ = (size_type)value_str_local.data_;
    value_str_04.data_ = (char *)this_local;
    local_40 = (Enum)ParseI32Value(this,&local_3c,value_str_04);
    bVar2 = wabt::Failed((Result)local_40);
    if (bVar2) {
      wabt::Result::Result((Result *)((long)&value_str_local.size_ + 4),Error);
      return (Result)value_str_local.size_._4_4_;
    }
    wabt::interp::Value::Set<unsigned_int>((Value *)out_nan_local,local_3c);
  }
  wabt::Result::Result((Result *)((long)&value_str_local.size_ + 4),Ok);
  return (Result)value_str_local.size_._4_4_;
}

Assistant:

wabt::Result JSONParser::ParseConstValue(Type type,
                                         Value* out_value,
                                         ExpectedNan* out_nan,
                                         string_view value_str,
                                         AllowExpected allow_expected) {
  *out_nan = ExpectedNan::None;

  switch (type) {
    case Type::I32: {
      uint32_t value;
      CHECK_RESULT(ParseI32Value(&value, value_str));
      out_value->Set(value);
      break;
    }

    case Type::F32: {
      uint32_t value_bits;
      CHECK_RESULT(
          ParseF32Value(&value_bits, out_nan, value_str, allow_expected));
      out_value->Set(Bitcast<f32>(value_bits));
      break;
    }

    case Type::I64: {
      uint64_t value;
      CHECK_RESULT(ParseI64Value(&value, value_str));
      out_value->Set(value);
      break;
    }

    case Type::F64: {
      uint64_t value_bits;
      CHECK_RESULT(
          ParseF64Value(&value_bits, out_nan, value_str, allow_expected));
      out_value->Set(Bitcast<f64>(value_bits));
      break;
    }

    case Type::V128:
      assert(false);  // Should use ParseLaneConstValue instead.
      break;

    case Type::FuncRef:
      if (value_str == "null") {
        out_value->Set(Ref::Null);
      } else {
        assert(allow_expected == AllowExpected::Yes);
        out_value->Set(Ref{1});
      }
      break;

    case Type::ExternRef:
      if (value_str == "null") {
        out_value->Set(Ref::Null);
      } else {
        uint32_t value;
        CHECK_RESULT(ParseI32Value(&value, value_str));
        // TODO: hack, just whatever ref is at this index; but skip null (which
        // is always 0).
        out_value->Set(Ref{value + 1});
      }
      break;

    default:
      PrintError("unknown concrete type: \"%s\"", type.GetName());
      return wabt::Result::Error;
  }

  return wabt::Result::Ok;
}